

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t VELOCYPACK_XXH64(void *input,size_t len,XXH64_hash_t seed)

{
  xxh_u64 xVar1;
  XXH_alignment in_stack_0000003c;
  xxh_u64 in_stack_00000040;
  size_t in_stack_00000048;
  xxh_u8 *in_stack_00000050;
  
  xVar1 = XXH64_endian_align(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c
                            );
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t XXH64(const void* input, size_t len,
                                  XXH64_hash_t seed) {
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH64_state_t state;
    XXH64_reset(&state, seed);
    XXH64_update(&state, (const xxh_u8*)input, len);
    return XXH64_digest(&state);
#else
  if (XXH_FORCE_ALIGN_CHECK) {
    if ((((size_t)input) & 7) ==
        0) { /* Input is aligned, let's leverage the speed advantage */
      return XXH64_endian_align((const xxh_u8*)input, len, seed, XXH_aligned);
    }
  }

  return XXH64_endian_align((const xxh_u8*)input, len, seed, XXH_unaligned);

#endif
}